

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O2

void recff_buffer_method_put(jit_State *J,RecordFFData *rd)

{
  TRef ud;
  TRef TVar1;
  uint uVar2;
  TRef TVar3;
  TRef TVar4;
  TRef *pTVar5;
  uint uVar6;
  IRRef1 IVar7;
  long lVar8;
  
  ud = recff_sbufx_check(J,rd,0);
  TVar1 = recff_sbufx_write(J,ud);
  pTVar5 = J->base;
  if (pTVar5[1] == 0) {
    return;
  }
  lVar8 = 1;
  do {
    uVar2 = pTVar5[lVar8];
    if (uVar2 == 0) {
      (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x12000000;
      lj_opt_fold(J);
      return;
    }
    uVar6 = uVar2 & 0x1f000000;
    if (uVar6 == 0x4000000) {
LAB_00138381:
      (J->fold).ins.field_0.ot = 0x5689;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
      (J->fold).ins.field_0.op2 = (IRRef1)uVar2;
      TVar1 = lj_opt_fold(J);
    }
    else {
      if ((uVar2 >> 0x18 & 0x1e) - 0xe < 6) {
        (J->fold).ins.field_0.ot = 0x5d04;
        (J->fold).ins.field_0.op1 = (IRRef1)uVar2;
        *(ushort *)((long)&(J->fold).ins + 2) = (ushort)(uVar6 == 0xe000000);
        uVar2 = lj_opt_fold(J);
        goto LAB_00138381;
      }
      if (uVar6 == 0xc000000) {
        TVar3 = recff_sbufx_check(J,rd,(int)lVar8);
        IVar7 = (IRRef1)TVar3;
        (J->fold).ins.field_0.op1 = IVar7;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45090015;
        TVar3 = lj_opt_fold(J);
        (J->fold).ins.field_0.op1 = IVar7;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45090010;
        TVar4 = lj_opt_fold(J);
        (J->fold).ins.field_0.ot = 0x2a15;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
        TVar4 = lj_opt_fold(J);
        (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b131275;
        TVar4 = lj_opt_fold(J);
        (J->fold).ins.field_0.ot = 0x989;
        (J->fold).ins.field_0.op1 = (IRRef1)ud;
        (J->fold).ins.field_0.op2 = IVar7;
        lj_opt_fold(J);
        TVar1 = lj_ir_call(J,IRCALL_lj_buf_putmem,(ulong)TVar1,(ulong)TVar3,(ulong)TVar4);
      }
      else {
        recff_nyi(J,rd);
      }
    }
    lVar8 = lVar8 + 1;
    pTVar5 = J->base;
  } while( true );
}

Assistant:

static void LJ_FASTCALL recff_buffer_method_put(jit_State *J, RecordFFData *rd)
{
  TRef ud = recff_sbufx_check(J, rd, 0);
  TRef trbuf = recff_sbufx_write(J, ud);
  TRef tr;
  ptrdiff_t arg;
  if (!J->base[1]) return;
  for (arg = 1; (tr = J->base[arg]); arg++) {
    if (tref_isstr(tr)) {
      trbuf = emitir(IRTG(IR_BUFPUT, IRT_PGC), trbuf, tr);
    } else if (tref_isnumber(tr)) {
      trbuf = emitir(IRTG(IR_BUFPUT, IRT_PGC), trbuf,
		     emitir(IRT(IR_TOSTR, IRT_STR), tr,
			    tref_isnum(tr) ? IRTOSTR_NUM : IRTOSTR_INT));
    } else if (tref_isudata(tr)) {
      TRef ud2 = recff_sbufx_check(J, rd, arg);
      TRef trr = recff_sbufx_get_ptr(J, ud2, IRFL_SBUF_R);
      TRef trw = recff_sbufx_get_ptr(J, ud2, IRFL_SBUF_W);
      TRef len = recff_sbufx_len(J, trr, trw);
      emitir(IRTG(IR_NE, IRT_PGC), ud, ud2);
      trbuf = lj_ir_call(J, IRCALL_lj_buf_putmem, trbuf, trr, len);
    } else {
      recff_nyiu(J, rd);
    }
  }
  emitir(IRT(IR_USE, IRT_NIL), trbuf, 0);
}